

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O2

bool Assimp::IFC::PointInPoly
               (IfcVector3 *p,
               vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *boundary)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  uint uVar5;
  vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  intersected_boundary;
  IfcVector3 local_48;
  
  intersected_boundary.
  super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  intersected_boundary.
  super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  intersected_boundary.
  super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.z = p->z + 0.0;
  local_48.x = p->x + 1.0;
  local_48.y = p->y + 0.0;
  IntersectsBoundaryProfile(p,&local_48,boundary,true,&intersected_boundary,true);
  ppVar3 = intersected_boundary.
           super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = intersected_boundary.
           super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (intersected_boundary.
      super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      intersected_boundary.
      super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    intersected_boundary.
    super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         intersected_boundary.
         super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_48.z = p->z + 0.0;
  local_48.x = p->x + 0.0;
  local_48.y = p->y + 1.0;
  IntersectsBoundaryProfile(p,&local_48,boundary,true,&intersected_boundary,true);
  ppVar4 = intersected_boundary.
           super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = intersected_boundary.
           super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (intersected_boundary.
      super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      intersected_boundary.
      super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    intersected_boundary.
    super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         intersected_boundary.
         super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_48.z = p->z + 0.0;
  local_48.x = p->x + 0.6;
  local_48.y = p->y + -0.6;
  IntersectsBoundaryProfile(p,&local_48,boundary,true,&intersected_boundary,true);
  uVar5 = (int)intersected_boundary.
               super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
          (int)intersected_boundary.
               super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ::~_Vector_base(&intersected_boundary.
                   super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                 );
  return 1 < ((uint)((int)ppVar4 - (int)ppVar2) >> 5 & 1) +
             ((uint)((int)ppVar3 - (int)ppVar1) >> 5 & 1) + (uint)((uVar5 >> 5 & 1) != 0);
}

Assistant:

bool PointInPoly(const IfcVector3& p, const std::vector<IfcVector3>& boundary)
{
    // even-odd algorithm: take a random vector that extends from p to infinite
    // and counts how many times it intersects edges of the boundary.
    // because checking for segment intersections is prone to numeric inaccuracies
    // or double detections (i.e. when hitting multiple adjacent segments at their
    // shared vertices) we do it thrice with different rays and vote on it.

    // the even-odd algorithm doesn't work for points which lie directly on
    // the border of the polygon. If any of our attempts produces this result,
    // we return false immediately.

    std::vector<std::pair<size_t, IfcVector3> > intersected_boundary;
    size_t votes = 0;

    IntersectsBoundaryProfile(p, p + IfcVector3(1.0, 0, 0), boundary, true, intersected_boundary, true);
    votes += intersected_boundary.size() % 2;

    intersected_boundary.clear();
    IntersectsBoundaryProfile(p, p + IfcVector3(0, 1.0, 0), boundary, true, intersected_boundary, true);
    votes += intersected_boundary.size() % 2;

    intersected_boundary.clear();
    IntersectsBoundaryProfile(p, p + IfcVector3(0.6, -0.6, 0.0), boundary, true, intersected_boundary, true);
    votes += intersected_boundary.size() % 2;

    return votes > 1;
}